

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O1

void compactor_shutdown(void)

{
  avl_node *node;
  avl_node *paVar1;
  ulong uVar2;
  void *ret;
  void *local_30;
  
  if (compactor_tids != (pthread_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    LOCK();
    compactor_terminate_signal.super___atomic_base<unsigned_char>._M_i =
         (__atomic_base<unsigned_char>)'\x01';
    UNLOCK();
    pthread_cond_broadcast((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    if (num_compactor_threads != 0) {
      uVar2 = 0;
      do {
        if (compactor_tids[uVar2] != 0) {
          pthread_join(compactor_tids[uVar2],&local_30);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < num_compactor_threads);
    }
    free(compactor_tids);
    compactor_tids = (pthread_t *)0x0;
    pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
    node = avl_first(&openfiles);
    while (node != (avl_node *)0x0) {
      paVar1 = avl_next(node);
      if ((((ulong)(node[-0xc].right)->left & 0x1000000000) != 0) &&
         (*(char *)((long)&node[-1].left + 6) == '\0')) {
        remove((char *)(node[-0xc].right)->parent);
        filemgr_free_func((hash_elem *)(node[-0xc].right + 10));
      }
      avl_remove(&openfiles,node);
      free(node + -0x36);
      node = paVar1;
    }
    sleep_duration = 0x7080;
    compactor_initialized = '\0';
    pthread_mutex_destroy((pthread_mutex_t *)&sync_mutex);
    pthread_cond_destroy((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    pthread_mutex_destroy((pthread_mutex_t *)&cpt_lock);
  }
  return;
}

Assistant:

void compactor_shutdown()
{
    void *ret;
    struct avl_node *a = NULL;
    struct openfiles_elem *elem;

    if (!compactor_tids) {
        return;
    }

    // set terminate signal
    mutex_lock(&sync_mutex);
    compactor_terminate_signal = 1;
    thread_cond_broadcast(&sync_cond);
    mutex_unlock(&sync_mutex);

    for (size_t i = 0; i < num_compactor_threads; ++i) {
        if (!compactor_tids[i]) continue;
        thread_join(compactor_tids[i], &ret);
    }
    free(compactor_tids);
    compactor_tids = NULL;

    mutex_lock(&cpt_lock);
    // free all elems in the tree
    a = avl_first(&openfiles);
    while (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        a = avl_next(a);

        if (_compactor_check_file_removal(elem)) {
            // remove file if removal is pended.
            remove(elem->file->filename);
            filemgr_free_func(&elem->file->e);
        }

        avl_remove(&openfiles, &elem->avl);
        free(elem);
    }

    sleep_duration = FDB_COMPACTOR_SLEEP_DURATION;
    compactor_initialized = 0;
    mutex_destroy(&sync_mutex);
    thread_cond_destroy(&sync_cond);
    mutex_unlock(&cpt_lock);

    mutex_destroy(&cpt_lock);
}